

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_3.cpp
# Opt level: O0

void __thiscall Date::Date(Date *this,int y,int m,int d)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  int local_18;
  int d_local;
  int m_local;
  int y_local;
  Date *this_local;
  
  this->y = y;
  this->m = m;
  this->d = d;
  local_1c = d;
  local_18 = m;
  d_local = y;
  _m_local = this;
  bVar1 = is_valid(this);
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    operator<<(local_198,this);
    std::__cxx11::stringstream::str();
    std::operator+(&local_1d8,&local_1f8," is not a valid date");
    error(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

Date::Date(int y, int m, int d) : y{ y }, m{ m }, d{ d } 
{
	if (!is_valid(*this))
	{
		std::stringstream ss;
		ss << *this;
		error(ss.str() + " is not a valid date");
	}
}